

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

void __thiscall deqp::egl::MakeCurrentPerfCase::logResults(MakeCurrentPerfCase *this)

{
  undefined8 uVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  TestContext *this_01;
  float fVar3;
  uint uVar4;
  pointer puVar5;
  SampleBuilder *this_02;
  ulong uVar6;
  pointer puVar7;
  int precision;
  long lVar8;
  long lVar9;
  ulong uVar10;
  pointer puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ScopedLogSection section;
  float local_2c8;
  float local_2c4;
  float local_2bc;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  string local_290;
  string local_270;
  LogSampleList local_250;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  pointer local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  string local_190;
  string local_170;
  qpSampleValueTag local_150;
  ios_base local_138 [264];
  
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Result","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Result","");
  tcu::LogSampleList::LogSampleList(&local_250,&local_290,&local_1d0);
  tcu::TestLog::startSampleList
            ((TestLog *)&this_00->_M_allocated_capacity,&local_250.m_name,&local_250.m_description);
  tcu::TestLog::startSampleInfo((TestLog *)&this_00->_M_allocated_capacity);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Time","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Time","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"us","");
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_1b0,&local_270,&local_1f0,&local_210,QP_SAMPLE_VALUE_TAG_RESPONSE
            );
  tcu::TestLog::writeValueInfo
            ((TestLog *)&this_00->_M_allocated_capacity,(string *)local_1b0,&local_190,&local_170,
             local_150);
  tcu::TestLog::endSampleInfo((TestLog *)&this_00->_M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])&aStack_1a0) {
    operator_delete((void *)local_1b0,aStack_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.m_description._M_dataplus._M_p != &local_250.m_description.field_2) {
    operator_delete(local_250.m_description._M_dataplus._M_p,
                    local_250.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.m_name._M_dataplus._M_p != &local_250.m_name.field_2) {
    operator_delete(local_250.m_name._M_dataplus._M_p,
                    local_250.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  puVar5 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_samples).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3)) {
    lVar9 = 0;
    do {
      local_1a8 = (pointer)0x0;
      aStack_1a0._M_allocated_capacity = 0;
      aStack_1a0._8_8_ = 0;
      local_1b0 = (undefined1  [8])this_00;
      this_02 = tcu::SampleBuilder::operator<<((SampleBuilder *)local_1b0,puVar5[lVar9]);
      tcu::SampleBuilder::operator<<(this_02,(EndSampleToken *)&tcu::TestLog::EndSample);
      if (local_1a8 != (pointer)0x0) {
        operator_delete(local_1a8,aStack_1a0._8_8_ - (long)local_1a8);
      }
      lVar9 = lVar9 + 1;
      puVar5 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(this->m_samples).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5)
                          >> 3));
  }
  tcu::TestLog::endSampleList((TestLog *)&this_00->_M_allocated_capacity);
  puVar7 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar11 = puVar7;
  if (puVar7 != puVar5) {
    uVar6 = (long)puVar5 - (long)puVar7 >> 3;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar7,puVar5,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar7,puVar5);
    puVar7 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar11 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  uVar6 = (long)puVar7 - (long)puVar11 >> 3;
  iVar2 = (this->m_spec).iterationCount;
  uVar4 = (uint)uVar6;
  if ((int)uVar4 < 1) {
    lVar9 = 0;
    local_2a8 = 0.0;
  }
  else {
    uVar10 = 0;
    lVar9 = 0;
    do {
      lVar9 = lVar9 + puVar11[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar10);
    lVar8 = ((ulong)(uVar4 - 1) + 1) * (long)iVar2;
    auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = 0x45300000;
    local_2a8 = (auVar14._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  }
  uVar1 = *(undefined8 *)((long)puVar11 + (uVar6 & 0xfffffffffffffffe) * 4);
  auVar15._0_8_ = (double)CONCAT44(0x43300000,(int)uVar1);
  auVar15._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar15._12_4_ = 0x45300000;
  dVar13 = (double)iVar2;
  fVar17 = (float)(((auVar15._8_8_ - 1.9342813113834067e+25) + (auVar15._0_8_ - 4503599627370496.0))
                  / dVar13);
  if ((int)uVar4 < 1) {
    local_2c8 = 0.0;
  }
  else {
    local_2c8 = 0.0;
    uVar10 = 0;
    do {
      fVar18 = (float)((((double)CONCAT44(0x45300000,(int)(puVar11[uVar10] >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)puVar11[uVar10]) - 4503599627370496.0)) /
                      dVar13) - fVar17;
      local_2c8 = local_2c8 + fVar18 * fVar18;
      uVar10 = uVar10 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar10);
    if (0 < (int)uVar4) {
      fVar20 = 3.4028235e+38;
      fVar18 = 0.0;
      uVar10 = 0;
      do {
        fVar19 = (float)((((double)CONCAT44(0x45300000,(int)(puVar11[uVar10] >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)puVar11[uVar10]) - 4503599627370496.0)) /
                        dVar13);
        fVar3 = fVar19;
        if (fVar20 <= fVar19) {
          fVar3 = fVar20;
        }
        fVar20 = fVar3;
        if (fVar19 <= fVar18) {
          fVar19 = fVar18;
        }
        fVar18 = fVar19;
        uVar10 = uVar10 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar10);
      local_2bc = (float)uVar6;
      local_2b0 = (double)fVar20;
      local_2b8 = (double)fVar18;
      local_2c8 = local_2c8 / local_2bc;
      if ((int)uVar4 < 1) {
        local_2c4 = 0.0;
      }
      else {
        local_2c4 = ((float)((((double)CONCAT44(0x45300000,(int)(puVar11[uVar4 - 1] >> 0x20)) -
                              1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)puVar11[uVar4 - 1]) -
                             4503599627370496.0)) / dVar13) - fVar17) / local_2c8;
        local_2c4 = local_2c4 * local_2c4;
      }
      goto LAB_001f2916;
    }
  }
  local_2bc = (float)uVar6;
  local_2c8 = local_2c8 / local_2bc;
  local_2c4 = 0.0;
  local_2b0 = 3.4028234663852886e+38;
  local_2b8 = 0.0;
LAB_001f2916:
  paVar12 = &local_250.m_name.field_2;
  local_1b0 = (undefined1  [8])&aStack_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Result","");
  local_250.m_name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"Statistics from results.","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_290,(TestLog *)&this_00->_M_allocated_capacity,
             (string *)local_1b0,&local_250.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.m_name._M_dataplus._M_p != paVar12) {
    operator_delete(local_250.m_name._M_dataplus._M_p,
                    local_250.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])&aStack_1a0) {
    operator_delete((void *)local_1b0,aStack_1a0._M_allocated_capacity + 1);
  }
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Total time: ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"us",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Mean: ",6);
  auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar16._0_8_ = lVar9;
  auVar16._12_4_ = 0x45300000;
  fVar18 = (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / local_2a8);
  std::ostream::_M_insert<double>((double)fVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"us",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Median: ",8);
  std::ostream::_M_insert<double>((double)fVar17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"us",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Variance: ",10);
  std::ostream::_M_insert<double>((double)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"us",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Skewness: ",10);
  std::ostream::_M_insert<double>((double)(local_2c4 / local_2bc));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"us",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Min: ",5);
  std::ostream::_M_insert<double>(local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"us",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Max: ",5);
  std::ostream::_M_insert<double>(local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"us",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  tcu::TestLog::endSection((TestLog *)local_290._M_dataplus._M_p);
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  de::floatToString_abi_cxx11_((string *)local_1b0,(de *)0x2,fVar18,precision);
  tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_1b0);
  if (local_1b0 != (undefined1  [8])&aStack_1a0) {
    operator_delete((void *)local_1b0,aStack_1a0._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::logResults (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::SampleList("Result", "Result")
		<< TestLog::SampleInfo << TestLog::ValueInfo("Time", "Time", "us", QP_SAMPLE_VALUE_TAG_RESPONSE)
		<< TestLog::EndSampleInfo;

	for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		log << TestLog::Sample << deInt64(m_samples[sampleNdx]) << TestLog::EndSample;

	log << TestLog::EndSampleList;

	// Log stats
	{
		deUint64	totalTimeUs				= 0;
		deUint64	totalIterationCount		= 0;

		float		iterationTimeMeanUs		= 0.0f;
		float		iterationTimeMedianUs	= 0.0f;
		float		iterationTimeVarianceUs	= 0.0f;
		float		iterationTimeSkewnessUs	= 0.0f;
		float		iterationTimeMinUs		= std::numeric_limits<float>::max();
		float		iterationTimeMaxUs		= 0.0f;

		std::sort(m_samples.begin(), m_samples.end());

		// Calculate totals
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			totalTimeUs			+= m_samples[sampleNdx];
			totalIterationCount	+= m_spec.iterationCount;
		}

		// Calculate mean and median
		iterationTimeMeanUs		= ((float)(((double)totalTimeUs) / (double)totalIterationCount));
		iterationTimeMedianUs	= ((float)(((double)m_samples[m_samples.size() / 2]) / (double)m_spec.iterationCount));

		// Calculate variance
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeVarianceUs	+= std::pow(iterationTimeUs - iterationTimeMedianUs, 2.0f);
		}

		// Calculate min and max
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeMinUs		= std::min<float>(iterationTimeMinUs, iterationTimeUs);
			iterationTimeMaxUs		= std::max<float>(iterationTimeMaxUs, iterationTimeUs);
		}

		iterationTimeVarianceUs /= (float)m_samples.size();

		// Calculate skewness
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeSkewnessUs	= std::pow((iterationTimeUs - iterationTimeMedianUs) / iterationTimeVarianceUs, 2.0f);
		}

		iterationTimeSkewnessUs /= (float)m_samples.size();

		{
			tcu::ScopedLogSection	section(log, "Result", "Statistics from results.");

			log << TestLog::Message << "Total time: "	<< totalTimeUs				<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Mean: "			<< iterationTimeMeanUs		<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Median: "		<< iterationTimeMedianUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Variance: "		<< iterationTimeVarianceUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Skewness: "		<< iterationTimeSkewnessUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Min: "			<< iterationTimeMinUs		<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Max: "			<< iterationTimeMaxUs		<< "us" << TestLog::EndMessage;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)(((double)totalTimeUs)/(double)totalIterationCount), 2).c_str());
	}
}